

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drbg.c
# Opt level: O0

size_t get_entropy(DRBG_CTX *ctx,uchar **pout,int entropy,size_t min_len,size_t max_len)

{
  int iVar1;
  size_t sVar2;
  undefined4 in_R9D;
  uint p_str;
  size_t bytes;
  uint *in_stack_00000030;
  PROV_DRBG *in_stack_00000038;
  PROV_DRBG *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  PROV_DRBG *drbg;
  uint in_stack_ffffffffffffffbc;
  uchar **in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  DRBG_CTX *local_10;
  size_t local_8;
  
  local_10 = ctx;
  if (*(long *)(ctx + 0x30) == 0) {
    local_8 = ossl_prov_get_entropy
                        ((PROV_CTX *)CONCAT44(in_R9D,in_stack_ffffffffffffffc8),
                         in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                         (size_t)in_stack_ffffffffffffffb0,(size_t)in_stack_ffffffffffffffa8);
  }
  else if (*(long *)(ctx + 0x60) == 0) {
    ERR_new();
    ERR_set_debug((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                  in_stack_ffffffffffffffb0);
    ERR_set_error(0x39,0xbb,(char *)0x0);
    local_8 = 0;
  }
  else {
    iVar1 = get_parent_strength(in_stack_00000038,in_stack_00000030);
    if (iVar1 == 0) {
      local_8 = 0;
    }
    else if (in_stack_ffffffffffffffbc < *(uint *)(local_10 + 0x80)) {
      ERR_new();
      ERR_set_debug((char *)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc,
                    in_stack_ffffffffffffffb0);
      ERR_set_error(0x39,0xc2,(char *)0x0);
      local_8 = 0;
    }
    else {
      iVar1 = ossl_drbg_lock_parent(in_stack_ffffffffffffffa8);
      if (iVar1 == 0) {
        local_8 = 0;
      }
      else {
        drbg = (PROV_DRBG *)0x8;
        sVar2 = (**(code **)(local_10 + 0x60))
                          (*(undefined8 *)(local_10 + 0x30),pout,*(undefined4 *)(local_10 + 0x80),
                           min_len,max_len,in_R9D,&local_10);
        ossl_drbg_unlock_parent(drbg);
        local_8 = sVar2;
      }
    }
  }
  return local_8;
}

Assistant:

static size_t get_entropy(PROV_DRBG *drbg, unsigned char **pout, int entropy,
                          size_t min_len, size_t max_len,
                          int prediction_resistance)
{
    size_t bytes;
    unsigned int p_str;

    if (drbg->parent == NULL)
#ifdef FIPS_MODULE
        return ossl_crngt_get_entropy(drbg, pout, entropy, min_len, max_len,
                                      prediction_resistance);
#else
        return ossl_prov_get_entropy(drbg->provctx, pout, entropy, min_len,
                                     max_len);
#endif

    if (drbg->parent_get_seed == NULL) {
        ERR_raise(ERR_LIB_PROV, PROV_R_PARENT_CANNOT_SUPPLY_ENTROPY_SEED);
        return 0;
    }
    if (!get_parent_strength(drbg, &p_str))
        return 0;
    if (drbg->strength > p_str) {
        /*
         * We currently don't support the algorithm from NIST SP 800-90C
         * 10.1.2 to use a weaker DRBG as source
         */
        ERR_raise(ERR_LIB_PROV, PROV_R_PARENT_STRENGTH_TOO_WEAK);
        return 0;
    }

    /*
     * Our lock is already held, but we need to lock our parent before
     * generating bits from it.  Note: taking the lock will be a no-op
     * if locking is not required (while drbg->parent->lock == NULL).
     */
    if (!ossl_drbg_lock_parent(drbg))
        return 0;
    /*
     * Get random data from parent.  Include our DRBG address as
     * additional input, in order to provide a distinction between
     * different DRBG child instances.
     *
     * Note: using the sizeof() operator on a pointer triggers
     *       a warning in some static code analyzers, but it's
     *       intentional and correct here.
     */
    bytes = drbg->parent_get_seed(drbg->parent, pout, drbg->strength,
                                  min_len, max_len, prediction_resistance,
                                  (unsigned char *)&drbg, sizeof(drbg));
    ossl_drbg_unlock_parent(drbg);
    return bytes;
}